

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdGetBlindTxBlindData
              (void *handle,void *blind_handle,uint32_t index,uint32_t *vout,char **asset,
              int64_t *value_satoshi,char **asset_blind_factor,char **value_blind_factor,
              char **issuance_txid,uint32_t *issuance_vout,bool *is_issuance_asset,
              bool *is_issuance_token)

{
  uint32_t uVar1;
  undefined8 uVar2;
  string *message;
  string *psVar3;
  int64_t iVar4;
  uint32_t *in_RCX;
  uint in_EDX;
  long in_RSI;
  undefined8 *in_R8;
  int64_t *in_R9;
  Amount AVar5;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  undefined8 *in_stack_00000018;
  uint32_t *in_stack_00000020;
  byte *in_stack_00000028;
  byte *in_stack_00000030;
  CfdException *except;
  exception *std_except;
  value_type *data;
  CfdCapiBlindTxData *buffer;
  char *work_txid;
  char *work_value_blind_factor;
  char *work_asset_blind_factor;
  char *work_asset;
  int result;
  string *in_stack_fffffffffffffd40;
  CfdError in_stack_fffffffffffffd4c;
  CfdException *in_stack_fffffffffffffd50;
  Txid local_228;
  string local_208;
  string local_1e8;
  string *in_stack_fffffffffffffe38;
  void *in_stack_fffffffffffffe40;
  Amount local_198;
  string local_188;
  reference local_168;
  undefined1 local_15a;
  allocator local_159;
  string local_158 [32];
  CfdSourceLocation local_138;
  undefined1 local_11a;
  allocator local_119;
  string local_118 [32];
  CfdSourceLocation local_f8;
  undefined1 local_da;
  allocator local_d9;
  string local_d8 [32];
  CfdSourceLocation local_b8;
  long local_a0;
  allocator local_91;
  string local_90 [48];
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  undefined4 local_3c;
  int64_t *local_38;
  undefined8 *local_30;
  uint32_t *local_28;
  uint local_1c;
  long local_18;
  
  local_3c = 0xffffffff;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  local_58 = (char *)0x0;
  local_60 = (char *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"BlindTxData",&local_91);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  local_a0 = local_18;
  if (*(long *)(local_18 + 0x38) == 0) {
    local_b8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_b8.filename = local_b8.filename + 1;
    local_b8.line = 0x5b5;
    local_b8.funcname = "CfdGetBlindTxBlindData";
    cfd::core::logger::warn<>(&local_b8,"buffer state is illegal.");
    local_da = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"Failed to parameter. buffer state is illegal.",&local_d9)
    ;
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,in_stack_fffffffffffffd40);
    local_da = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((*(byte *)(local_18 + 0x30) & 1) == 0) {
    local_f8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_f8.filename = local_f8.filename + 1;
    local_f8.line = 0x5bb;
    local_f8.funcname = "CfdGetBlindTxBlindData";
    cfd::core::logger::warn<>(&local_f8,"unused collect blinder.");
    local_11a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_118,"Failed to collect state. unused collect blinder.",&local_119);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,in_stack_fffffffffffffd40);
    local_11a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  message = (string *)(ulong)local_1c;
  psVar3 = (string *)
           std::vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_>::size
                     (*(vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> **)
                       (local_18 + 0x38));
  if (psVar3 <= message) {
    local_138.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_138.filename = local_138.filename + 1;
    local_138.line = 0x5c1;
    local_138.funcname = "CfdGetBlindTxBlindData";
    cfd::core::logger::warn<>(&local_138,"index out of range.");
    local_15a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"Failed to parameter. index out of range.",&local_159);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,in_stack_fffffffffffffd40);
    local_15a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_168 = std::vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_>::operator[]
                        (*(vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> **)
                          (local_a0 + 0x38),(ulong)local_1c);
  if (local_28 != (uint32_t *)0x0) {
    *local_28 = local_168->vout;
  }
  if (local_30 != (undefined8 *)0x0) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_188,&local_168->asset);
    local_48 = cfd::capi::CreateString(message);
    std::__cxx11::string::~string((string *)&local_188);
  }
  if (local_38 != (int64_t *)0x0) {
    AVar5 = cfd::core::ConfidentialValue::GetAmount(&local_168->value);
    local_198.amount_ = AVar5.amount_;
    local_198.ignore_check_ = AVar5.ignore_check_;
    iVar4 = cfd::core::Amount::GetSatoshiValue(&local_198);
    *local_38 = iVar4;
  }
  if (in_stack_00000008 != (undefined8 *)0x0) {
    cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)&stack0xfffffffffffffe38,&local_168->abf);
    local_50 = cfd::capi::CreateString(message);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe38);
  }
  if (in_stack_00000010 != (undefined8 *)0x0) {
    cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_1e8,&local_168->vbf);
    local_58 = cfd::capi::CreateString(message);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  if ((in_stack_00000018 != (undefined8 *)0x0) && (in_stack_00000020 != (uint32_t *)0x0)) {
    uVar1 = cfd::core::OutPoint::GetVout(&local_168->issuance_outpoint);
    *in_stack_00000020 = uVar1;
    cfd::core::OutPoint::GetTxid(&local_228,&local_168->issuance_outpoint);
    cfd::core::Txid::GetHex_abi_cxx11_(&local_208,&local_228);
    local_60 = cfd::capi::CreateString(message);
    std::__cxx11::string::~string((string *)&local_208);
    cfd::core::Txid::~Txid((Txid *)0x5b1aa6);
  }
  if (in_stack_00000028 != (byte *)0x0) {
    *in_stack_00000028 = local_168->is_issuance & 1;
  }
  if (in_stack_00000030 != (byte *)0x0) {
    *in_stack_00000030 = local_168->is_issuance_token & 1;
  }
  if (local_48 != (char *)0x0) {
    *local_30 = local_48;
  }
  if (local_50 != (char *)0x0) {
    *in_stack_00000008 = local_50;
  }
  if (local_58 != (char *)0x0) {
    *in_stack_00000010 = local_58;
  }
  if (local_60 != (char *)0x0) {
    *in_stack_00000018 = local_60;
  }
  return 0;
}

Assistant:

int CfdGetBlindTxBlindData(
    void* handle, void* blind_handle, uint32_t index, uint32_t* vout,
    char** asset, int64_t* value_satoshi, char** asset_blind_factor,
    char** value_blind_factor, char** issuance_txid, uint32_t* issuance_vout,
    bool* is_issuance_asset, bool* is_issuance_token) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_asset = nullptr;
  char* work_asset_blind_factor = nullptr;
  char* work_value_blind_factor = nullptr;
  char* work_txid = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(blind_handle, kPrefixBlindTxData);

    CfdCapiBlindTxData* buffer =
        static_cast<CfdCapiBlindTxData*>(blind_handle);
    if (buffer->blinder_list == nullptr) {
      warn(CFD_LOG_SOURCE, "buffer state is illegal.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. buffer state is illegal.");
    }
    if (!buffer->has_collect_blinder) {
      warn(CFD_LOG_SOURCE, "unused collect blinder.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to collect state. unused collect blinder.");
    }
    if (index >= buffer->blinder_list->size()) {
      warn(CFD_LOG_SOURCE, "index out of range.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. index out of range.");
    }

    auto& data = (*buffer->blinder_list)[index];
    if (vout != nullptr) *vout = data.vout;
    if (asset != nullptr) {
      work_asset = CreateString(data.asset.GetHex());
    }
    if (value_satoshi != nullptr) {
      *value_satoshi = data.value.GetAmount().GetSatoshiValue();
    }
    if (asset_blind_factor != nullptr) {
      work_asset_blind_factor = CreateString(data.abf.GetHex());
    }
    if (value_blind_factor != nullptr) {
      work_value_blind_factor = CreateString(data.vbf.GetHex());
    }
    if ((issuance_txid != nullptr) && (issuance_vout != nullptr)) {
      *issuance_vout = data.issuance_outpoint.GetVout();
      work_txid = CreateString(data.issuance_outpoint.GetTxid().GetHex());
    }
    if (is_issuance_asset != nullptr) *is_issuance_asset = data.is_issuance;
    if (is_issuance_token != nullptr) {
      *is_issuance_token = data.is_issuance_token;
    }

    if (work_asset != nullptr) *asset = work_asset;
    if (work_asset_blind_factor != nullptr)
      *asset_blind_factor = work_asset_blind_factor;
    if (work_value_blind_factor != nullptr)
      *value_blind_factor = work_value_blind_factor;
    if (work_txid != nullptr) *issuance_txid = work_txid;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_asset, &work_asset_blind_factor);
  FreeBufferOnError(&work_value_blind_factor, &work_txid);
  return result;
}